

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O1

Move * cuddZddSiftingUp(DdManager *table,int x,int x_low,int initial_size)

{
  DdHalfWord x_00;
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  double dVar5;
  
  if (x_low < x) {
    pDVar3 = (DdNode *)0x0;
    do {
      x_00 = x - 1;
      iVar1 = cuddZddSwapInPlace(table,x_00,x);
      if ((iVar1 == 0) || (pDVar2 = cuddDynamicAllocNode(table), pDVar2 == (DdNode *)0x0)) {
        if (pDVar3 != (DdNode *)0x0) {
          pDVar2 = table->nextFree;
          do {
            pDVar4 = pDVar3;
            pDVar3 = (pDVar4->type).kids.T;
            pDVar4->ref = 0;
            pDVar4->next = pDVar2;
            pDVar2 = pDVar4;
          } while (pDVar3 != (DdNode *)0x0);
          table->nextFree = pDVar4;
        }
        goto LAB_007ff443;
      }
      pDVar2->index = x_00;
      pDVar2->ref = x;
      *(int *)((long)&pDVar2->next + 4) = iVar1;
      dVar5 = (double)initial_size;
      (pDVar2->type).kids.T = pDVar3;
      if (iVar1 < initial_size) {
        initial_size = iVar1;
      }
    } while (((double)iVar1 <= dVar5 * table->maxGrowth) &&
            (pDVar3 = pDVar2, x = x_00, x_low < (int)x_00));
  }
  else {
LAB_007ff443:
    pDVar2 = (DdNode *)0x0;
  }
  return (Move *)pDVar2;
}

Assistant:

static Move *
cuddZddSiftingUp(
  DdManager * table,
  int  x,
  int  x_low,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;

    moves = NULL;
    y = cuddZddNextLow(table, x);
    while (y >= x_low) {
        size = cuddZddSwapInPlace(table, y, x);
        if (size == 0)
            goto cuddZddSiftingUpOutOfMem;
        move = (Move *)cuddDynamicAllocNode(table);
        if (move == NULL)
            goto cuddZddSiftingUpOutOfMem;
        move->x = y;
        move->y = x;
        move->size = size;
        move->next = moves;
        moves = move;

        if ((double)size > (double)limit_size * table->maxGrowth)
            break;
        if (size < limit_size)
            limit_size = size;

        x = y;
        y = cuddZddNextLow(table, x);
    }
    return(moves);

cuddZddSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(NULL);

}